

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O3

void __thiscall CCamera::OnRender(CCamera *this)

{
  vec2 vVar1;
  CNetObj_PlayerInfo *pCVar2;
  CGameClient *pCVar3;
  vec2 vVar4;
  IClient *pIVar5;
  CConfig *pCVar6;
  float fVar7;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar8;
  vec2 vVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar17;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar18;
  undefined1 auVar19 [16];
  float local_38;
  float fStack_34;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar20;
  
  pCVar3 = (this->super_CComponent).m_pClient;
  pIVar5 = pCVar3->m_pClient;
  if (pIVar5->m_State - 3U < 2) {
    this->m_Zoom = 1.0;
    if ((((pCVar3->m_Snap).m_SpecInfo.m_Active == true) &&
        ((pCVar3->m_Snap).m_SpecInfo.m_UsePosition == false)) &&
       (((pCVar3->m_Snap).m_SpecInfo.m_SpecMode == 0 ||
        ((pCVar2 = (pCVar3->m_Snap).m_pLocalInfo, pCVar2 != (CNetObj_PlayerInfo *)0x0 &&
         ((pCVar2->m_PlayerFlags & 0x10) == 0)))))) {
      if (this->m_CamType != 0) {
        pCVar3->m_pControls->m_MousePos = this->m_PrevCenter;
        CControls::ClampMousePos(((this->super_CComponent).m_pClient)->m_pControls);
        this->m_CamType = 0;
        pCVar3 = (this->super_CComponent).m_pClient;
      }
      vVar4 = pCVar3->m_pControls->m_MousePos;
      this->m_Center = vVar4;
      goto LAB_00135229;
    }
    if (this->m_CamType != 1) {
      CControls::ClampMousePos(pCVar3->m_pControls);
      this->m_CamType = 1;
      pIVar5 = ((this->super_CComponent).m_pClient)->m_pClient;
    }
    fVar15 = pIVar5->m_RenderFrameTime;
    if (OnRender()::s_LastMousePos == '\0') {
      OnRender();
    }
    if (OnRender()::s_CurrentCameraOffset == '\0') {
      OnRender();
    }
    pCVar3 = (this->super_CComponent).m_pClient;
    pCVar6 = pCVar3->m_pConfig;
    if (0 < pCVar6->m_ClCameraSmoothness) {
      fVar13 = ((float)pCVar6->m_ClCameraSmoothness / -100.0 + 1.0) * 9.5 + 0.5;
      OnRender::s_SpeedBias = fVar13 * fVar15 + OnRender::s_SpeedBias;
      if (pCVar6->m_ClDynamicCamera == 0) {
        OnRender::s_SpeedBias = 5.0;
        if (5.0 <= fVar13) {
          OnRender::s_SpeedBias = fVar13;
        }
      }
      else {
        fVar10 = (pCVar3->m_pControls->m_MousePos).field_0.x - OnRender::s_LastMousePos.field_0.x;
        fVar14 = (pCVar3->m_pControls->m_MousePos).field_1.y - OnRender::s_LastMousePos.field_1.y;
        fVar7 = log10f((float)pCVar6->m_ClCameraStabilizing / 100.0 + 1.0);
        fVar7 = fVar7 * SQRT(fVar10 * fVar10 + fVar14 * fVar14) * -0.02 + OnRender::s_SpeedBias;
        if (fVar7 <= fVar13) {
          fVar13 = fVar7;
        }
        pCVar3 = (this->super_CComponent).m_pClient;
        pCVar6 = pCVar3->m_pConfig;
        OnRender::s_SpeedBias =
             (float)(-(uint)(fVar7 < 0.5) & 0x3f000000 | ~-(uint)(fVar7 < 0.5) & (uint)fVar13);
      }
    }
    OnRender::s_LastMousePos = pCVar3->m_pControls->m_MousePos;
    vVar9.field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0;
    vVar9.field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
    if (pCVar6->m_ClDynamicCamera != 0) {
      auVar11._8_8_ = 0;
      auVar11._0_4_ = OnRender::s_LastMousePos.field_0;
      auVar11._4_4_ = OnRender::s_LastMousePos.field_1;
      auVar16._0_4_ =
           SQRT(OnRender::s_LastMousePos.field_0.x * OnRender::s_LastMousePos.field_0.x +
                OnRender::s_LastMousePos.field_1.y * OnRender::s_LastMousePos.field_1.y);
      if (0.0001 < auVar16._0_4_) {
        fVar13 = auVar16._0_4_ - (float)pCVar6->m_ClMouseDeadzone;
        if (fVar13 <= 0.0) {
          fVar13 = 0.0;
        }
        fVar13 = fVar13 * ((float)pCVar6->m_ClMouseFollowfactor / 100.0);
        auVar16._4_4_ = auVar16._0_4_;
        auVar16._8_4_ = auVar16._0_4_;
        auVar16._12_4_ = auVar16._0_4_;
        auVar12 = divps(auVar11,auVar16);
        vVar9.field_0.x = fVar13 * auVar12._0_4_;
        vVar9.field_1.y = fVar13 * auVar12._4_4_;
      }
    }
    if (0 < pCVar6->m_ClCameraSmoothness) {
      fVar15 = fVar15 * OnRender::s_SpeedBias;
      if (1.0 <= fVar15) {
        fVar15 = 1.0;
      }
      aVar18 = vVar9.field_1;
      vVar9.field_0.x =
           fVar15 * (vVar9.field_0.x - OnRender::s_CurrentCameraOffset.field_0.x) +
           OnRender::s_CurrentCameraOffset.field_0.x;
      vVar9.field_1.y =
           fVar15 * (aVar18.y - OnRender::s_CurrentCameraOffset.field_1.y) +
           OnRender::s_CurrentCameraOffset.field_1.y;
    }
    if ((pCVar3->m_Snap).m_SpecInfo.m_Active == true) {
      vVar1 = (pCVar3->m_Snap).m_SpecInfo.m_Position;
    }
    else {
      vVar1 = pCVar3->m_LocalCharacterPos;
    }
    vVar4.field_0.x = vVar1.field_0.x + vVar9.field_0.x;
    vVar4.field_1.y = vVar1.field_1.y + vVar9.field_1.y;
    OnRender::s_CurrentCameraOffset = vVar9;
  }
  else {
    this->m_Zoom = 0.7;
    if (OnRender()::Dir == '\0') {
      OnRender();
    }
    aVar17 = (this->m_RotationCenter).field_0;
    aVar18 = (this->m_RotationCenter).field_1;
    fVar15 = (this->m_Center).field_0.x - aVar17.x;
    fVar13 = (this->m_Center).field_1.y - aVar18.y;
    pCVar3 = (this->super_CComponent).m_pClient;
    pCVar6 = pCVar3->m_pConfig;
    fVar7 = (float)pCVar6->m_ClRotationRadius;
    if (SQRT(fVar15 * fVar15 + fVar13 * fVar13) <= fVar7 + 0.5) {
      fVar15 = ((360.0 / (float)pCVar6->m_ClRotationSpeed) * pCVar3->m_pClient->m_RenderFrameTime *
               3.1415927) / 180.0;
      fVar13 = sinf(fVar15);
      fVar15 = cosf(fVar15);
      fVar7 = (float)((this->super_CComponent).m_pClient)->m_pConfig->m_ClRotationRadius;
      aVar17.x = OnRender::Dir.field_0.x * fVar15 + -fVar13 * OnRender::Dir.field_1.y;
      aVar18.y = OnRender::Dir.field_0.x * fVar13 + fVar15 * OnRender::Dir.field_1.y;
      OnRender::Dir.field_1.y = aVar18.y;
      OnRender::Dir.field_0.x = aVar17.x;
      vVar4.field_0.x = (this->m_RotationCenter).field_0.x + fVar7 * aVar17.x;
      vVar4.field_1.y = (this->m_RotationCenter).field_1.y + fVar7 * aVar18.y;
      this->m_Center = vVar4;
      goto LAB_00135229;
    }
    aVar8 = (this->m_AnimationStartPos).field_0;
    auVar19._0_4_ = aVar8.x - aVar17.x;
    aVar20 = (this->m_AnimationStartPos).field_1;
    auVar19._4_4_ = aVar20.y - aVar18.y;
    auVar19._8_8_ = 0;
    auVar12._0_4_ = SQRT(auVar19._0_4_ * auVar19._0_4_ + auVar19._4_4_ * auVar19._4_4_);
    auVar12._4_4_ = auVar12._0_4_;
    auVar12._8_4_ = auVar12._0_4_;
    auVar12._12_4_ = auVar12._0_4_;
    auVar12 = divps(auVar19,auVar12);
    OnRender::Dir = auVar12._0_8_;
    fVar15 = ((float)pCVar6->m_ClCameraSpeed * pCVar3->m_pClient->m_RenderFrameTime) / 10.0 +
             this->m_MoveTime;
    this->m_MoveTime = fVar15;
    fVar15 = powf(1.0 - fVar15,7.0);
    local_38 = auVar12._0_4_;
    fStack_34 = auVar12._4_4_;
    fVar13 = fVar7 * local_38 + aVar17.x;
    fVar7 = fVar7 * fStack_34 + aVar18.y;
    fVar10 = aVar8.x - fVar13;
    fVar14 = aVar20.y - fVar7;
    fVar15 = SQRT(fVar10 * fVar10 + fVar14 * fVar14) * fVar15;
    vVar4.field_0.x = fVar15 * OnRender::Dir.field_0.x + fVar13;
    vVar4.field_1.y = fVar15 * OnRender::Dir.field_1.y + fVar7;
  }
  this->m_Center = vVar4;
LAB_00135229:
  this->m_PrevCenter = vVar4;
  return;
}

Assistant:

void CCamera::OnRender()
{
	if(Client()->State() == IClient::STATE_ONLINE || Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		m_Zoom = 1.0f;

		// update camera center
		if(m_pClient->m_Snap.m_SpecInfo.m_Active && !m_pClient->m_Snap.m_SpecInfo.m_UsePosition &&
			(m_pClient->m_Snap.m_SpecInfo.m_SpecMode == SPEC_FREEVIEW || (m_pClient->m_Snap.m_pLocalInfo && !(m_pClient->m_Snap.m_pLocalInfo->m_PlayerFlags&PLAYERFLAG_DEAD))))
		{
			if(m_CamType != CAMTYPE_SPEC)
			{
				m_pClient->m_pControls->m_MousePos = m_PrevCenter;
				m_pClient->m_pControls->ClampMousePos();
				m_CamType = CAMTYPE_SPEC;
			}
			m_Center = m_pClient->m_pControls->m_MousePos;
		}
		else
		{
			if(m_CamType != CAMTYPE_PLAYER)
			{
				m_pClient->m_pControls->ClampMousePos();
				m_CamType = CAMTYPE_PLAYER;
			}

			float DeltaTime = Client()->RenderFrameTime();
			static vec2 s_LastMousePos(0, 0);
			static vec2 s_CurrentCameraOffset(0, 0);
			static float s_SpeedBias = 0.5f;

			if(Config()->m_ClCameraSmoothness > 0)
			{
				float CameraSpeed = (1.0f - (Config()->m_ClCameraSmoothness / 100.0f)) * 9.5f + 0.5f;
				float CameraStabilizingFactor = 1 + Config()->m_ClCameraStabilizing / 100.0f;

				s_SpeedBias += CameraSpeed * DeltaTime;
				if(Config()->m_ClDynamicCamera)
				{
					s_SpeedBias -= length(m_pClient->m_pControls->m_MousePos - s_LastMousePos) * log10f(CameraStabilizingFactor) * 0.02f;
					s_SpeedBias = clamp(s_SpeedBias, 0.5f, CameraSpeed);
				}
				else
				{
					s_SpeedBias = maximum(5.0f, CameraSpeed); // make sure toggle back is fast
				}
			}

			vec2 TargetCameraOffset(0, 0);
			s_LastMousePos = m_pClient->m_pControls->m_MousePos;
			float l = length(s_LastMousePos);
			if(Config()->m_ClDynamicCamera && l > 0.0001f) // make sure that this isn't 0
			{
				float DeadZone = Config()->m_ClMouseDeadzone;
				float FollowFactor = Config()->m_ClMouseFollowfactor/100.0f;
				float OffsetAmount = maximum(l-DeadZone, 0.0f) * FollowFactor;

				TargetCameraOffset = normalize(m_pClient->m_pControls->m_MousePos)*OffsetAmount;
			}
			
			if(Config()->m_ClCameraSmoothness > 0)
				s_CurrentCameraOffset += (TargetCameraOffset - s_CurrentCameraOffset) * minimum(DeltaTime * s_SpeedBias, 1.0f);
			else
				s_CurrentCameraOffset = TargetCameraOffset;
			
			if(m_pClient->m_Snap.m_SpecInfo.m_Active)
				m_Center = m_pClient->m_Snap.m_SpecInfo.m_Position + s_CurrentCameraOffset;
			else
				m_Center = m_pClient->m_LocalCharacterPos + s_CurrentCameraOffset;
		}
	}
	else
	{
		m_Zoom = 0.7f;
		static vec2 Dir = vec2(1.0f, 0.0f);

		if(distance(m_Center, m_RotationCenter) <= (float)Config()->m_ClRotationRadius+0.5f)
		{
			// do little rotation
			float RotPerTick = 360.0f/(float)Config()->m_ClRotationSpeed * Client()->RenderFrameTime();
			Dir = rotate(Dir, RotPerTick);
			m_Center = m_RotationCenter+Dir*(float)Config()->m_ClRotationRadius;
		}
		else
		{
			// positions for the animation
			Dir = normalize(m_AnimationStartPos - m_RotationCenter);
			vec2 TargetPos = m_RotationCenter + Dir * (float)Config()->m_ClRotationRadius;
			float Distance = distance(m_AnimationStartPos, TargetPos);

			// move time
			m_MoveTime += Client()->RenderFrameTime()*Config()->m_ClCameraSpeed / 10.0f;
			float XVal = 1 - m_MoveTime;
			XVal = pow(XVal, 7.0f);

			m_Center = TargetPos + Dir * (XVal*Distance);
		}
	}

	m_PrevCenter = m_Center;
}